

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O2

void __thiscall
pstd::vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>::resize
          (vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_> *this,size_type n
          )

{
  memory_resource *pmVar1;
  ulong uVar2;
  
  if (n < this->nStored) {
    if (n == 0) {
      pmVar1 = (this->alloc).memoryResource;
      (*pmVar1->_vptr_memory_resource[3])(pmVar1,this->ptr,this->nAlloc,1);
      this->ptr = (uchar *)0x0;
      this->nAlloc = 0;
    }
  }
  else if (this->nStored < n) {
    reserve(this,n);
    for (uVar2 = this->nStored; uVar2 < n; uVar2 = uVar2 + 1) {
      this->ptr[uVar2] = '\0';
    }
  }
  this->nStored = n;
  return;
}

Assistant:

void resize(size_type n) {
        if (n < size()) {
            for (size_t i = n; i < size(); ++i)
                alloc.destroy(ptr + i);
            if (n == 0) {
                alloc.deallocate_object(ptr, nAlloc);
                ptr = nullptr;
                nAlloc = 0;
            }
        } else if (n > size()) {
            reserve(n);
            for (size_t i = nStored; i < n; ++i)
                alloc.construct(ptr + i);
        }
        nStored = n;
    }